

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,short>(BaseAppender *this,Vector *col,long input)

{
  short sVar1;
  short *psVar2;
  idx_t iVar3;
  long in_RDI;
  long unaff_retaddr;
  
  sVar1 = Cast::Operation<long,short>(unaff_retaddr);
  psVar2 = FlatVector::GetData<short>((Vector *)0x93e606);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  psVar2[iVar3] = sVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}